

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

bool __thiscall
Ptex::v2_4::PtexReader::MetaData::findKey(MetaData *this,char *key,int *index,MetaDataType *type)

{
  iterator this_00;
  pointer ppVar1;
  MetaDataType *in_RCX;
  uint32_t *in_RDX;
  iterator iter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>_>
  *in_stack_ffffffffffffff68;
  _Self local_70 [2];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  _Self local_30;
  MetaDataType *local_28;
  uint32_t *local_20;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>_>
            ::find(in_stack_ffffffffffffff68,(key_type *)0xab42c8);
  local_30._M_node = this_00._M_node;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>_>
       ::end(this_00._M_node);
  local_1 = std::operator==(&local_30,local_70);
  if (local_1) {
    *local_20 = 0xffffffff;
  }
  else {
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>
                           *)0xab4366);
    *local_20 = (ppVar1->second).index;
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>
                           *)0xab437a);
    *local_28 = (ppVar1->second).type;
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

virtual bool findKey(const char* key, int& index, MetaDataType& type)
	{
	    MetaMap::iterator iter = _map.find(key);
	    if (iter==_map.end()) {
		index = -1;
		return false;
	    }
	    index = iter->second.index;
	    type = iter->second.type;
	    return true;
	}